

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_prepare_pipeline(demo *demo)

{
  VkResult VVar1;
  uint uVar2;
  undefined4 local_338 [2];
  VkPipelineShaderStageCreateInfo shaderStages [2];
  VkPipelineColorBlendAttachmentState att_state [1];
  undefined4 local_2a8;
  VkResult err;
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkDynamicState dynamicStateEnables [9];
  undefined4 local_258 [2];
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineViewportStateCreateInfo vp;
  VkPipelineDepthStencilStateCreateInfo ds;
  VkPipelineColorBlendStateCreateInfo cb;
  VkPipelineRasterizationStateCreateInfo rs;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineVertexInputStateCreateInfo vi;
  VkPipelineCacheCreateInfo pipelineCache;
  VkGraphicsPipelineCreateInfo pipeline;
  demo *demo_local;
  
  memset(&dynamicState.pDynamicStates,0,0x24);
  memset(&local_2a8,0,0x20);
  local_2a8 = 0x1b;
  dynamicState._16_8_ = &dynamicState.pDynamicStates;
  memset(&pipelineCache.pInitialData,0,0x90);
  pipelineCache.pInitialData._0_4_ = 0x1c;
  memcpy(&ia.primitiveRestartEnable,&(demo->vertices).vi,0x30);
  memset(&rs.lineWidth,0,0x20);
  rs.lineWidth = 2.8026e-44;
  ia.pNext._4_4_ = 3;
  memset(cb.blendConstants + 2,0,0x40);
  cb.blendConstants[2] = 3.22299e-44;
  rs.depthClampEnable = 0;
  rs.rasterizerDiscardEnable = 2;
  rs.polygonMode = VK_POLYGON_MODE_LINE;
  rs.pNext._4_4_ = 0;
  rs.flags = 0;
  rs.cullMode = 0;
  rs.depthBiasClamp = 1.0;
  memset(&ds.minDepthBounds,0,0x38);
  ds.minDepthBounds = 3.64338e-44;
  memset(&shaderStages[1].pSpecializationInfo,0,0x20);
  shaderStages[1].pSpecializationInfo._0_4_ = 0;
  cb.logicOpEnable = 1;
  cb._24_8_ = &shaderStages[1].pSpecializationInfo;
  memset(&ms.alphaToCoverageEnable,0,0x30);
  ms.alphaToCoverageEnable = 0x16;
  vp.pNext._4_4_ = 1;
  uVar2 = dynamicState.pNext._4_4_ + 1;
  dynamicStateEnables[(ulong)dynamicState.pNext._4_4_ - 2] = VK_DYNAMIC_STATE_VIEWPORT;
  vp.pViewports._0_4_ = 1;
  dynamicState.pNext._4_4_ = dynamicState.pNext._4_4_ + 2;
  dynamicStateEnables[(ulong)uVar2 - 2] = VK_DYNAMIC_STATE_SCISSOR;
  memset(&vp.pScissors,0,0x68);
  vp.pScissors._0_4_ = 0x19;
  ds.pNext._4_4_ = 1;
  ds.flags = 1;
  ds.depthTestEnable = 3;
  ds.depthWriteEnable = 0;
  ds.front.writeMask = 0;
  ds.front.reference = 0;
  ds.back.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  ds.depthCompareOp = VK_COMPARE_OP_NEVER;
  ds.depthBoundsTestEnable = 0;
  ds.stencilTestEnable = 0;
  ds.front.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  ds.front.failOp = ds.back.failOp;
  ds.front.depthFailOp = ds.back.depthFailOp;
  ds.front.compareOp = ds.back.compareOp;
  ds.front.compareMask = ds.back.compareMask;
  memset(local_258,0,0x30);
  local_258[0] = 0x18;
  ms.sampleShadingEnable = 0;
  ms.minSampleShading = 0.0;
  ms.pNext._4_4_ = 1;
  memset(local_338,0,0x60);
  local_338[0] = 0x12;
  shaderStages[0].pNext._4_4_ = 1;
  shaderStages[0]._16_8_ = demo_prepare_vs(demo);
  shaderStages[0].module = (VkShaderModule)anon_var_dwarf_8018;
  shaderStages[0].pSpecializationInfo._0_4_ = 0x12;
  shaderStages[1].pNext._4_4_ = 0x10;
  shaderStages[1]._16_8_ = demo_prepare_fs(demo);
  shaderStages[1].module = (VkShaderModule)anon_var_dwarf_8018;
  memset(&vi.pVertexAttributeDescriptions,0,0x28);
  vi.pVertexAttributeDescriptions._0_4_ = 0x11;
  VVar1 = (*glad_vkCreatePipelineCache)
                    (demo->device,(VkPipelineCacheCreateInfo *)&vi.pVertexAttributeDescriptions,
                     (VkAllocationCallbacks *)0x0,&demo->pipelineCache);
  if (VVar1 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x542,"void demo_prepare_pipeline(struct demo *)");
  }
  VVar1 = (*glad_vkCreateGraphicsPipelines)
                    (demo->device,demo->pipelineCache,1,
                     (VkGraphicsPipelineCreateInfo *)&pipelineCache.pInitialData,
                     (VkAllocationCallbacks *)0x0,&demo->pipeline);
  if (VVar1 == VK_SUCCESS) {
    (*glad_vkDestroyPipelineCache)(demo->device,demo->pipelineCache,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroyShaderModule)
              (demo->device,demo->frag_shader_module,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroyShaderModule)
              (demo->device,demo->vert_shader_module,(VkAllocationCallbacks *)0x0);
    return;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                ,0x545,"void demo_prepare_pipeline(struct demo *)");
}

Assistant:

static void demo_prepare_pipeline(struct demo *demo) {
    VkGraphicsPipelineCreateInfo pipeline;
    VkPipelineCacheCreateInfo pipelineCache;

    VkPipelineVertexInputStateCreateInfo vi;
    VkPipelineInputAssemblyStateCreateInfo ia;
    VkPipelineRasterizationStateCreateInfo rs;
    VkPipelineColorBlendStateCreateInfo cb;
    VkPipelineDepthStencilStateCreateInfo ds;
    VkPipelineViewportStateCreateInfo vp;
    VkPipelineMultisampleStateCreateInfo ms;
    VkDynamicState dynamicStateEnables[(VK_DYNAMIC_STATE_STENCIL_REFERENCE - VK_DYNAMIC_STATE_VIEWPORT + 1)];
    VkPipelineDynamicStateCreateInfo dynamicState;

    VkResult U_ASSERT_ONLY err;

    memset(dynamicStateEnables, 0, sizeof dynamicStateEnables);
    memset(&dynamicState, 0, sizeof dynamicState);
    dynamicState.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
    dynamicState.pDynamicStates = dynamicStateEnables;

    memset(&pipeline, 0, sizeof(pipeline));
    pipeline.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    pipeline.layout = demo->pipeline_layout;

    vi = demo->vertices.vi;

    memset(&ia, 0, sizeof(ia));
    ia.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    ia.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;

    memset(&rs, 0, sizeof(rs));
    rs.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
    rs.polygonMode = VK_POLYGON_MODE_FILL;
    rs.cullMode = VK_CULL_MODE_BACK_BIT;
    rs.frontFace = VK_FRONT_FACE_CLOCKWISE;
    rs.depthClampEnable = VK_FALSE;
    rs.rasterizerDiscardEnable = VK_FALSE;
    rs.depthBiasEnable = VK_FALSE;
    rs.lineWidth = 1.0f;

    memset(&cb, 0, sizeof(cb));
    cb.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
    VkPipelineColorBlendAttachmentState att_state[1];
    memset(att_state, 0, sizeof(att_state));
    att_state[0].colorWriteMask = 0xf;
    att_state[0].blendEnable = VK_FALSE;
    cb.attachmentCount = 1;
    cb.pAttachments = att_state;

    memset(&vp, 0, sizeof(vp));
    vp.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
    vp.viewportCount = 1;
    dynamicStateEnables[dynamicState.dynamicStateCount++] =
        VK_DYNAMIC_STATE_VIEWPORT;
    vp.scissorCount = 1;
    dynamicStateEnables[dynamicState.dynamicStateCount++] =
        VK_DYNAMIC_STATE_SCISSOR;

    memset(&ds, 0, sizeof(ds));
    ds.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    ds.depthTestEnable = VK_TRUE;
    ds.depthWriteEnable = VK_TRUE;
    ds.depthCompareOp = VK_COMPARE_OP_LESS_OR_EQUAL;
    ds.depthBoundsTestEnable = VK_FALSE;
    ds.back.failOp = VK_STENCIL_OP_KEEP;
    ds.back.passOp = VK_STENCIL_OP_KEEP;
    ds.back.compareOp = VK_COMPARE_OP_ALWAYS;
    ds.stencilTestEnable = VK_FALSE;
    ds.front = ds.back;

    memset(&ms, 0, sizeof(ms));
    ms.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    ms.pSampleMask = NULL;
    ms.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;

    // Two stages: vs and fs
    pipeline.stageCount = 2;
    VkPipelineShaderStageCreateInfo shaderStages[2];
    memset(&shaderStages, 0, 2 * sizeof(VkPipelineShaderStageCreateInfo));

    shaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    shaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
    shaderStages[0].module = demo_prepare_vs(demo);
    shaderStages[0].pName = "main";

    shaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    shaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
    shaderStages[1].module = demo_prepare_fs(demo);
    shaderStages[1].pName = "main";

    pipeline.pVertexInputState = &vi;
    pipeline.pInputAssemblyState = &ia;
    pipeline.pRasterizationState = &rs;
    pipeline.pColorBlendState = &cb;
    pipeline.pMultisampleState = &ms;
    pipeline.pViewportState = &vp;
    pipeline.pDepthStencilState = &ds;
    pipeline.pStages = shaderStages;
    pipeline.renderPass = demo->render_pass;
    pipeline.pDynamicState = &dynamicState;

    memset(&pipelineCache, 0, sizeof(pipelineCache));
    pipelineCache.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;

    err = vkCreatePipelineCache(demo->device, &pipelineCache, NULL,
                                &demo->pipelineCache);
    assert(!err);
    err = vkCreateGraphicsPipelines(demo->device, demo->pipelineCache, 1,
                                    &pipeline, NULL, &demo->pipeline);
    assert(!err);

    vkDestroyPipelineCache(demo->device, demo->pipelineCache, NULL);

    vkDestroyShaderModule(demo->device, demo->frag_shader_module, NULL);
    vkDestroyShaderModule(demo->device, demo->vert_shader_module, NULL);
}